

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_utilities.h
# Opt level: O0

bool Gudhi::persistence_matrix::
     _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>>
               (Field_element *val,
               Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
               *source,Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                       *targetColumn)

{
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51;
  anon_class_16_2_6d7ca8c5 local_50;
  anon_class_16_2_6d7ca8c5 local_40;
  anon_class_1_0_00000001 local_29;
  Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  *local_28;
  Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  *targetColumn_local;
  Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  *source_local;
  Field_element *val_local;
  
  if (*val == 0) {
    val_local._7_1_ = false;
  }
  else {
    local_50.targetColumn = targetColumn;
    local_50.val = val;
    local_40.targetColumn = targetColumn;
    local_40.val = val;
    local_28 = targetColumn;
    targetColumn_local = source;
    source_local = (Intrusive_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                    *)val;
    val_local._7_1_ =
         _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>,Gudhi::persistence_matrix::_multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>>(Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>::Field_element_const&,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)8___lse,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>::Matrix_column_tag,3u>,false>___1_>
                   (source,targetColumn,&local_29,&local_40,&local_50,&local_51,&local_52);
  }
  return val_local._7_1_;
}

Assistant:

bool _multiply_source_and_add_to_column(const typename Column::Field_element& val,
                                        const Entry_range& source,
                                        Column& targetColumn)
{
  if (val == 0u) {
    return false;
  }

  return _generic_add_to_column(
      source,
      targetColumn,
      []([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&](typename Entry_range::const_iterator& itSource, const typename Column::Column_support::iterator& itTarget) {
        typename Column::Entry* entry =
            targetColumn._insert_entry(itSource->get_element(), itSource->get_row_index(), itTarget);
        targetColumn.operators_->multiply_inplace(entry->get_element(), val);
        if constexpr (Column::Master::Option_list::has_row_access) targetColumn.update_entry(*entry);
      },
      [&](typename Column::Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        targetColumn.operators_->multiply_and_add_inplace_back(itSource->get_element(), val, targetElement);
      },
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      []([[maybe_unused]] typename Column::Column_support::iterator& itTarget) {});
}